

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_sBIT(png_structrp png_ptr,png_const_color_8p sbit,int color_type)

{
  byte bVar1;
  size_t sStack_28;
  png_byte maxbits;
  size_t size;
  png_byte buf [4];
  int color_type_local;
  png_const_color_8p sbit_local;
  png_structrp png_ptr_local;
  
  size._4_4_ = color_type;
  _buf = sbit;
  if ((color_type & 2U) == 0) {
    if ((sbit->gray == '\0') || (png_ptr->usr_bit_depth < sbit->gray)) {
      png_warning(png_ptr,"Invalid sBIT depth specified");
      return;
    }
    size._0_1_ = sbit->gray;
    sStack_28 = 1;
  }
  else {
    if (color_type == 3) {
      bVar1 = 8;
    }
    else {
      bVar1 = png_ptr->usr_bit_depth;
    }
    if (((((sbit->red == '\0') || (bVar1 < sbit->red)) || (sbit->green == '\0')) ||
        ((bVar1 < sbit->green || (sbit->blue == '\0')))) || (bVar1 < sbit->blue)) {
      png_warning(png_ptr,"Invalid sBIT depth specified");
      return;
    }
    size._0_1_ = sbit->red;
    size._1_1_ = sbit->green;
    size._2_1_ = sbit->blue;
    sStack_28 = 3;
  }
  if ((color_type & 4U) != 0) {
    if ((sbit->alpha == '\0') || (png_ptr->usr_bit_depth < sbit->alpha)) {
      png_warning(png_ptr,"Invalid sBIT depth specified");
      return;
    }
    buf[sStack_28 - 8] = sbit->alpha;
    sStack_28 = sStack_28 + 1;
  }
  png_write_complete_chunk(png_ptr,0x73424954,(png_const_bytep)&size,sStack_28);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sBIT(png_structrp png_ptr, png_const_color_8p sbit, int color_type)
{
   png_byte buf[4];
   size_t size;

   png_debug(1, "in png_write_sBIT");

   /* Make sure we don't depend upon the order of PNG_COLOR_8 */
   if ((color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_byte maxbits;

      maxbits = (png_byte)(color_type==PNG_COLOR_TYPE_PALETTE ? 8 :
          png_ptr->usr_bit_depth);

      if (sbit->red == 0 || sbit->red > maxbits ||
          sbit->green == 0 || sbit->green > maxbits ||
          sbit->blue == 0 || sbit->blue > maxbits)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[0] = sbit->red;
      buf[1] = sbit->green;
      buf[2] = sbit->blue;
      size = 3;
   }

   else
   {
      if (sbit->gray == 0 || sbit->gray > png_ptr->usr_bit_depth)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[0] = sbit->gray;
      size = 1;
   }

   if ((color_type & PNG_COLOR_MASK_ALPHA) != 0)
   {
      if (sbit->alpha == 0 || sbit->alpha > png_ptr->usr_bit_depth)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[size++] = sbit->alpha;
   }

   png_write_complete_chunk(png_ptr, png_sBIT, buf, size);
}